

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::calcLocalGrad(FullyConnectedLayer *this,Array *errors)

{
  size_t sVar1;
  size_t sVar2;
  float *x_begin;
  float *x_end;
  float *y_begin;
  float *y_end;
  float *z_begin;
  float *z_end;
  Array *errors_local;
  FullyConnectedLayer *this_local;
  
  sVar1 = std::valarray<float>::size(&this->activationGrad);
  sVar2 = std::valarray<float>::size(errors);
  if (sVar1 != sVar2) {
    __assert_fail("activationGrad.size() == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5bb,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
  }
  sVar1 = std::valarray<float>::size(&this->localGrad);
  sVar2 = std::valarray<float>::size(errors);
  if (sVar1 == sVar2) {
    x_begin = std::begin<float>(&this->activationGrad);
    x_end = std::end<float>(&this->activationGrad);
    y_begin = std::begin<float>(errors);
    y_end = std::end<float>(errors);
    z_begin = std::begin<float>(&this->localGrad);
    z_end = std::end<float>(&this->localGrad);
    internal::emul<float*,float_const*,float*>(x_begin,x_end,y_begin,y_end,z_begin,z_end);
    return;
  }
  __assert_fail("localGrad.size() == errors.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x5bc,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
}

Assistant:

void calcLocalGrad(const Array &errors) {
        assert(activationGrad.size() == errors.size());
        assert(localGrad.size() == errors.size());
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        localGrad = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(localGrad), std::end(localGrad));
#endif
    }